

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_Predict(ARKodeMem ark_mem,int istage,N_Vector yguess)

{
  double *pdVar1;
  double dVar2;
  void *pvVar3;
  realtype *c;
  long lVar4;
  N_Vector *X;
  ulong uVar5;
  uint nvec;
  long lVar6;
  int iVar7;
  char *msgfmt;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double tau;
  double dVar12;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    ark_mem = (ARKodeMem)0x0;
  }
  else {
    if ((ark_mem->interp != (ARKInterp)0x0) || (2 < *(int *)((long)pvVar3 + 0xb0) - 1U)) {
      if ((ark_mem->initsetup == 0) && (*(int *)((long)pvVar3 + 0xb0) - 1U < 5)) {
        c = *(realtype **)((long)pvVar3 + 0x198);
        lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x68) + 0x18);
        lVar6 = (long)istage;
        dVar2 = ark_mem->h;
        tau = *(double *)(lVar4 + lVar6 * 8) * dVar2;
        dVar12 = tau / ark_mem->hold;
        X = *(N_Vector **)((long)pvVar3 + 0x1a0);
        switch(*(int *)((long)pvVar3 + 0xb0)) {
        case 1:
          iVar7 = arkPredict_MaximumOrder(ark_mem,dVar12,yguess);
          break;
        case 2:
          iVar7 = arkPredict_VariableOrder(ark_mem,dVar12,yguess);
          break;
        case 3:
          iVar7 = arkPredict_CutoffOrder(ark_mem,dVar12,yguess);
          break;
        case 4:
          uVar9 = 0;
          uVar8 = (ulong)(uint)istage;
          if (istage < 1) {
            uVar8 = uVar9;
          }
          uVar10 = 0xffffffffffffffff;
          for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
            pdVar1 = (double *)(lVar4 + uVar9 * 8);
            if (*pdVar1 != 0.0) {
              uVar10 = uVar9;
            }
            if (NAN(*pdVar1)) {
              uVar10 = uVar9;
            }
            uVar10 = uVar10 & 0xffffffff;
          }
          if ((int)uVar10 == -1) goto LAB_003a8efb;
          for (uVar9 = 0; lVar6 = (long)(int)uVar10, uVar8 != uVar9; uVar9 = uVar9 + 1) {
            dVar12 = *(double *)(lVar4 + uVar9 * 8);
            pdVar1 = (double *)(lVar4 + lVar6 * 8);
            uVar5 = uVar9;
            if (dVar12 < *pdVar1 || dVar12 == *pdVar1) {
              uVar5 = uVar10;
            }
            uVar10 = uVar10 & 0xffffffff;
            if (dVar12 != 0.0) {
              uVar10 = uVar5 & 0xffffffff;
            }
            if (NAN(dVar12)) {
              uVar10 = uVar5 & 0xffffffff;
            }
          }
          dVar12 = *(double *)(lVar4 + lVar6 * 8);
          bVar11 = *(int *)((long)pvVar3 + 0x1c) != 0;
          if (bVar11) {
            *c = 1.0;
            *X = *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + lVar6 * 8);
          }
          nvec = (uint)bVar11;
          if (*(int *)((long)pvVar3 + 0x18) != 0) {
            *(undefined8 *)((long)c + (ulong)(nvec * 8)) = 0x3ff0000000000000;
            *(undefined8 *)((long)X + (ulong)(nvec * 8)) =
                 *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + lVar6 * 8);
            nvec = nvec + 1;
          }
          iVar7 = arkPredict_Bootstrap(ark_mem,dVar2 * dVar12,tau,nvec,c,X,yguess);
          break;
        case 5:
          if (*(int *)((long)pvVar3 + 0x18) == 0) {
            uVar8 = 0;
          }
          else {
            uVar9 = 0;
            uVar8 = 0;
            if (0 < istage) {
              uVar8 = (ulong)(uint)istage;
            }
            for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
              c[uVar9] = ark_mem->h *
                         *(double *)
                          (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x60) + 0x10) + lVar6 * 8) +
                          uVar9 * 8);
              X[uVar9] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x28) + uVar9 * 8);
            }
          }
          iVar7 = (int)uVar8;
          if (*(int *)((long)pvVar3 + 0x1c) != 0) {
            uVar10 = 0;
            uVar9 = (ulong)(uint)istage;
            if (istage < 1) {
              uVar9 = uVar10;
            }
            for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
              c[uVar8 + uVar10] =
                   ark_mem->h *
                   *(double *)
                    (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x10) + lVar6 * 8) +
                    uVar10 * 8);
              X[uVar8 + uVar10] = *(N_Vector *)(*(long *)((long)pvVar3 + 0x30) + uVar10 * 8);
            }
            iVar7 = iVar7 + (int)uVar10;
          }
          c[iVar7] = 1.0;
          X[iVar7] = ark_mem->yn;
          iVar7 = N_VLinearCombination(iVar7 + 1,c,X,yguess);
          if (iVar7 != 0) {
            return -0x1c;
          }
          return 0;
        }
        if (iVar7 != -0x16) {
          return iVar7;
        }
      }
LAB_003a8efb:
      N_VScale(1.0,ark_mem->yn,yguess);
      return 0;
    }
    msgfmt = "Interpolation structure is NULL";
  }
  arkProcessError(ark_mem,-0x15,"ARKode::ARKStep","arkStep_Predict",msgfmt);
  return -0x15;
}

Assistant:

int arkStep_Predict(ARKodeMem ark_mem, int istage, N_Vector yguess)
{
  int i, retval, jstage, nvec;
  realtype tau;
  realtype h;
  ARKodeARKStepMem step_mem;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_Predict", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* verify that interpolation structure is provided */
  if ((ark_mem->interp == NULL) && (step_mem->predictor > 0) && (step_mem->predictor < 4)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_Predict",
                    "Interpolation structure is NULL");
    return(ARK_MEM_NULL);
  }

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if the first step, use initial condition as guess */
  if (ark_mem->initsetup) {
    N_VScale(ONE, ark_mem->yn, yguess);
    return(ARK_SUCCESS);
  }

  /* set evaluation time tau as relative shift from previous successful time */
  tau = step_mem->Bi->c[istage]*ark_mem->h/ark_mem->hold;

  /* use requested predictor formula */
  switch (step_mem->predictor) {

  case 1:

    /***** Interpolatory Predictor 1 -- all to max order *****/
    retval = arkPredict_MaximumOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 2:

    /***** Interpolatory Predictor 2 -- decrease order w/ increasing level of extrapolation *****/
    retval = arkPredict_VariableOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 3:

    /***** Cutoff predictor: max order interpolatory output for stages "close"
           to previous step, first-order predictor for subsequent stages *****/
    retval = arkPredict_CutoffOrder(ark_mem, tau, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 4:

    /***** Bootstrap predictor: if any previous stage in step has nonzero c_i,
           construct a quadratic Hermite interpolant for prediction; otherwise
           use the trivial predictor.  The actual calculations are performed in
           arkPredict_Bootstrap, but here we need to determine the appropriate
           stage, c_j, to use. *****/

    /* determine if any previous stages in step meet criteria */
    jstage = -1;
    for (i=0; i<istage; i++)
      jstage = (step_mem->Bi->c[i] != ZERO) ? i : jstage;

    /* if using the trivial predictor, break */
    if (jstage == -1)  break;

    /* find the "optimal" previous stage to use */
    for (i=0; i<istage; i++)
      if ( (step_mem->Bi->c[i] > step_mem->Bi->c[jstage]) &&
           (step_mem->Bi->c[i] != ZERO) )
        jstage = i;

    /* set stage time, stage RHS and interpolation values */
    h = ark_mem->h * step_mem->Bi->c[jstage];
    tau = ark_mem->h * step_mem->Bi->c[istage];
    nvec = 0;
    if (step_mem->implicit) {    /* Implicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fi[jstage];
      nvec += 1;
    }
    if (step_mem->explicit) {    /* Explicit piece */
      cvals[nvec] = ONE;
      Xvecs[nvec] = step_mem->Fe[jstage];
      nvec += 1;
    }

    /* call predictor routine */
    retval = arkPredict_Bootstrap(ark_mem, h, tau, nvec, cvals, Xvecs, yguess);
    if (retval != ARK_ILL_INPUT)  return(retval);
    break;

  case 5:

    /***** Minimal correction predictor: use all previous stage
           information in this step *****/

    /* set arrays for fused vector operation */
    nvec = 0;
    if (step_mem->explicit) {       /* Explicit pieces */
      for (jstage=0; jstage<istage; jstage++) {
        cvals[nvec] = ark_mem->h * step_mem->Be->A[istage][jstage];
        Xvecs[nvec] = step_mem->Fe[jstage];
        nvec += 1;
      }
    }
    if (step_mem->implicit) {      /* Implicit pieces */
      for (jstage=0; jstage<istage; jstage++) {
        cvals[nvec] = ark_mem->h * step_mem->Bi->A[istage][jstage];
        Xvecs[nvec] = step_mem->Fi[jstage];
        nvec += 1;
      }
    }
    cvals[nvec] = ONE;
    Xvecs[nvec] = ark_mem->yn;
    nvec += 1;

    /* compute predictor */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yguess);
    if (retval != 0) return(ARK_VECTOROP_ERR);
    return(ARK_SUCCESS);
    break;

  }

  /* if we made it here, use the trivial predictor (previous step solution) */
  N_VScale(ONE, ark_mem->yn, yguess);
  return(ARK_SUCCESS);
}